

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::
SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
::reserve(SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
          *this,size_t count)

{
  unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
  *puVar1;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
  __ptr;
  ulong uVar2;
  AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
  *pAVar3;
  ulong uVar4;
  
  if (count >> 0x3d == 0) {
    uVar2 = this->buffer_capacity;
    if (uVar2 < count) {
      uVar4 = 8;
      if (8 < uVar2) {
        uVar4 = uVar2;
      }
      do {
        uVar2 = uVar4;
        uVar4 = uVar2 * 2;
      } while (uVar2 < count);
      if (uVar2 < 9) {
        pAVar3 = &this->stack_storage;
      }
      else {
        pAVar3 = (AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
                  *)malloc(uVar2 * 8);
      }
      if (pAVar3 == (AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
                     *)0x0) goto LAB_007b1a23;
      if ((pAVar3 != (AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
                      *)(this->
                        super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                        ).ptr) &&
         ((this->
          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
          ).buffer_size != 0)) {
        uVar4 = 0;
        do {
          puVar1 = (this->
                   super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                   ).ptr;
          *(SPIRAccessChain **)(pAVar3->aligned_char + uVar4 * 8) =
               (SPIRAccessChain *)
               puVar1[uVar4]._M_t.
               super___uniq_ptr_impl<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
               ._M_t.
               super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
               .super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>;
          puVar1[uVar4]._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
          .super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false> =
               (_Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>)0x0;
          puVar1 = (this->
                   super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                   ).ptr;
          __ptr.super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl =
               puVar1[uVar4]._M_t.
               super___uniq_ptr_impl<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
               ._M_t.
               super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
               .super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>;
          if (__ptr.super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>.
              _M_head_impl != (SPIRAccessChain *)0x0) {
            free((void *)__ptr.super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>
                         ._M_head_impl);
          }
          puVar1[uVar4]._M_t.
          super___uniq_ptr_impl<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
          .super__Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false> =
               (_Head_base<0UL,_diligent_spirv_cross::SPIRAccessChain_*,_false>)0x0;
          uVar4 = uVar4 + 1;
        } while (uVar4 < (this->
                         super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                         ).buffer_size);
      }
      puVar1 = (this->
               super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
               ).ptr;
      if ((AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
           *)puVar1 != &this->stack_storage) {
        free(puVar1);
      }
      (this->
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>_>
      ).ptr = (unique_ptr<diligent_spirv_cross::SPIRAccessChain,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRAccessChain>::MallocDeleter>
               *)pAVar3;
      this->buffer_capacity = uVar2;
    }
    return;
  }
LAB_007b1a23:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}